

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_string_concatenate_op(sexp ctx,sexp self,sexp_sint_t n,sexp str_ls,sexp sep)

{
  size_t __n;
  char *__dest;
  sexp in_RCX;
  sexp in_RDX;
  sexp_sint_t in_RSI;
  sexp in_RDI;
  int *in_R8;
  bool bVar1;
  char *csep;
  char *p;
  sexp_uint_t sep_len;
  sexp_uint_t i;
  sexp_uint_t len;
  sexp ls;
  sexp res;
  void *__src;
  sexp_uint_t in_stack_ffffffffffffffa0;
  size_t __n_00;
  sexp psVar2;
  sexp local_40;
  sexp in_stack_fffffffffffffff8;
  
  psVar2 = (sexp)0x0;
  __n_00 = 0;
  __src = (void *)0x0;
  local_40 = in_RCX;
  while( true ) {
    bVar1 = false;
    if (((ulong)local_40 & 3) == 0) {
      bVar1 = local_40->tag == 6;
    }
    if (!bVar1) break;
    if ((((local_40->value).stack.length & 3) != 0) || (((local_40->value).type.name)->tag != 9)) {
      psVar2 = sexp_type_exception(psVar2,(sexp)0x0,in_stack_ffffffffffffffa0,(sexp)0x0);
      return psVar2;
    }
    local_40 = (local_40->value).type.cpl;
    psVar2 = (sexp)((long)&psVar2->tag + 1);
  }
  if ((((psVar2 != (sexp)0x0) && (((ulong)in_R8 & 3) == 0)) && (*in_R8 == 9)) &&
     (__n_00 = *(size_t *)(in_R8 + 6), __n_00 != 0)) {
    __src = (void *)(*(long *)(in_R8 + 2) + 0x10 + *(long *)(in_R8 + 4));
  }
  local_40 = in_RCX;
  psVar2 = sexp_make_string_op(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX,in_RCX);
  __dest = (((psVar2->value).type.name)->value).flonum_bits + 8 + (long)(psVar2->value).type.cpl;
  while( true ) {
    bVar1 = false;
    if (((ulong)local_40 & 3) == 0) {
      bVar1 = local_40->tag == 6;
    }
    if (!bVar1) break;
    __n = (((local_40->value).type.name)->value).string.length;
    memcpy(__dest,(((((local_40->value).type.name)->value).type.name)->value).flonum_bits + 8 +
                  (long)(((local_40->value).type.name)->value).type.cpl,__n);
    __dest = __dest + __n;
    if (((__n_00 != 0) && (((local_40->value).string.offset & 3) == 0)) &&
       (((local_40->value).type.cpl)->tag == 6)) {
      memcpy(__dest,__src,__n_00);
      __dest = __dest + __n_00;
    }
    local_40 = (local_40->value).type.cpl;
  }
  *__dest = '\0';
  return psVar2;
}

Assistant:

sexp sexp_string_concatenate_op (sexp ctx, sexp self, sexp_sint_t n, sexp str_ls, sexp sep) {
  sexp res, ls;
  sexp_uint_t len=0, i=0, sep_len=0;
  char *p, *csep=NULL;
  for (ls=str_ls; sexp_pairp(ls); ls=sexp_cdr(ls), i++)
    if (! sexp_stringp(sexp_car(ls)))
      return sexp_type_exception(ctx, self, SEXP_STRING, sexp_car(ls));
    else
      len += sexp_string_size(sexp_car(ls));
  if ((i > 0) && sexp_stringp(sep) && ((sep_len=sexp_string_size(sep)) > 0)) {
    csep = sexp_string_data(sep);
    len += sep_len*(i-1);
  }
  res = sexp_make_string(ctx, sexp_make_fixnum(len), SEXP_VOID);
  p = sexp_string_data(res);
  for (ls=str_ls; sexp_pairp(ls); ls=sexp_cdr(ls)) {
    len = sexp_string_size(sexp_car(ls));
    memcpy(p, sexp_string_data(sexp_car(ls)), len);
    p += len;
    if (sep_len && sexp_pairp(sexp_cdr(ls))) {
      memcpy(p, csep, sep_len);
      p += sep_len;
    }
  }
  *p = '\0';
  sexp_update_string_index_lookup(ctx, res);
  return res;
}